

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O2

void __thiscall interfaces_tests::findAncestorByHash::test_method(findAncestorByHash *this)

{
  Chain *pCVar1;
  int iVar2;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  Chainstate *pCVar4;
  char *pcVar5;
  iterator pvVar6;
  iterator pvVar7;
  int *piVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar10;
  uint256 *puVar9;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  lazy_ostream local_138;
  undefined1 *local_128;
  char **local_120;
  assertion_result local_118;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  int height;
  undefined **local_d8;
  int *piStack_d0;
  undefined1 *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 uStack_90;
  undefined7 uStack_8f;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  uint256 local_78;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x59,"test_method","m_node.chainman");
  pvVar6 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock17,&cs_main,"Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x59,false);
  pcVar5 = "m_node.chainman";
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (puVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                      ,0x5b,"test_method","m_node.chainman");
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar3->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  height = -1;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5d;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = pvVar6;
  msg.m_begin = pcVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  pCVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            (&local_58,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x14]);
  CBlockIndex::GetBlockHash
            (&local_78,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[10]);
  local_d8 = (undefined **)0x0;
  local_98 = 0;
  uStack_97 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = (undefined1 *)0x0;
  pcStack_c0 = (char *)0x0;
  piStack_d0 = &height;
  iVar2 = (*pCVar1->_vptr_Chain[0xd])(pCVar1,&local_58,&local_78);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "chain->findAncestorByHash(active[20]->GetBlockHash(), active[10]->GetBlockHash(), FoundBlock().height(height))"
  ;
  local_140 = "";
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_150 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_120 = &local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,&local_138,1,0,WARN,_cVar10,(size_t)&local_158,0x5d);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5e;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  piStack_d0 = (int *)((ulong)piStack_d0 & 0xffffffffffffff00);
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  pcStack_c0 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_180 = "";
  local_58.super_base_blob<256U>.m_data._M_elems[0] = '\n';
  local_58.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  puVar9 = &local_58;
  pvVar6 = (iterator)0x2;
  piVar8 = &height;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_188,0x5e,1,2,piVar8,"height",puVar9,"10");
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5f;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = (iterator)piVar8;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  pCVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            (&local_58,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[10]);
  CBlockIndex::GetBlockHash
            (&local_78,
             (pCVar4->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x14]);
  local_98 = 0;
  uStack_97 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = (undefined1 *)0x0;
  pcStack_c0 = (char *)0x0;
  local_d8 = (undefined **)0x0;
  piStack_d0 = (int *)0x0;
  iVar2 = (*pCVar1->_vptr_Chain[0xd])(pCVar1,&local_58,&local_78);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar2 ^ 1);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_148 = "!chain->findAncestorByHash(active[10]->GetBlockHash(), active[20]->GetBlockHash())";
  local_140 = "";
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1b0 = "";
  local_120 = &local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,&local_138,1,0,WARN,(check_type)puVar9,(size_t)&local_1b8,0x5f);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findAncestorByHash)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    int height = -1;
    BOOST_CHECK(chain->findAncestorByHash(active[20]->GetBlockHash(), active[10]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, 10);
    BOOST_CHECK(!chain->findAncestorByHash(active[10]->GetBlockHash(), active[20]->GetBlockHash()));
}